

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O2

void opengv::generateRandom2D3DCorrespondences
               (translation_t *position,rotation_t *rotation,translations_t *camOffsets,
               rotations_t *camRotations,size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *bearingVectors,points_t *points,
               vector<int,_std::allocator<int>_> *camCorrespondences,MatrixXd *gt)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer piVar8;
  undefined1 auVar9 [16];
  double dVar10;
  size_t i_1;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  size_t i;
  double dVar15;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar16;
  undefined1 auVar17 [16];
  undefined1 in_XMM2 [16];
  rotation_t camRotation_1;
  translation_t camOffset;
  rotation_t camRotation;
  Vector3d local_78;
  point_t bodyPoint_1;
  point_t bodyPoint;
  
  for (dVar15 = 0.0;
      dVar10 = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_cols, (ulong)dVar15 < (ulong)dVar10;
      dVar15 = (double)((long)dVar15 + 1)) {
    generateRandomPoint((Vector3d *)&camRotation,8.0,4.0);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data +
                       (long)camRotation_1.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[1] * (long)dVar15);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = (double)gt;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = 0.0;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = dVar15;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1];
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&camRotation_1,
               (Matrix<double,_3,_1,_0,_3,_1> *)&camRotation);
  }
  pMVar4 = (camOffsets->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pMVar5 = (camOffsets->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = 0;
  uVar13 = 0;
  for (dVar15 = 0.0; (ulong)dVar15 < (ulong)dVar10; dVar15 = (double)((long)dVar15 + 1)) {
    pMVar6 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    camOffset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&pMVar6[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data + 0x10);
    pMVar6 = pMVar6 + uVar13;
    camOffset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
    camOffset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = *(double *)
            ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 8);
    pMVar7 = (camRotations->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = *(double *)
           ((long)&pMVar7[uVar13].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data + 0x40);
    pMVar7 = pMVar7 + uVar13;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 8);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x10);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x18);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x20);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x28);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [6] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x30);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [7] = *(double *)
           ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data + 0x38);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data +
                       (long)camRotation_1.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[1] * (long)dVar15);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = 0.0;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = (double)gt;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = dVar15;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1];
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &camRotation_1);
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)points,(Matrix<double,_3,_1,_0,_3,_1> *)&bodyPoint);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data +
                       (long)camRotation_1.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[2] * (long)dVar15);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = 0.0;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)rotation;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = (double)gt;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = dVar15;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = (double)position;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint,
               (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&camRotation_1);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)&camRotation;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = (double)&camOffset;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)&bodyPoint;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint_1,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&camRotation_1);
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)bearingVectors,(Matrix<double,_3,_1,_0,_3,_1> *)&bodyPoint_1);
    pMVar16 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              ((long)&(((bearingVectors->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
              + lVar11);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(pMVar16);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)pMVar16;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               ((long)&(((bearingVectors->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data + lVar11),
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&camRotation_1);
    if (0.0 < noise) {
      pMVar6 = (bearingVectors->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data + lVar11 + 0x10);
      pdVar2 = (double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar11);
      local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = *pdVar2;
      local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = pdVar2[1];
      addNoise((Vector3d *)&camRotation_1,noise,&local_78);
      pMVar6 = (bearingVectors->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(double *)
       ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar11 + 0x10) =
           camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      pdVar2 = (double *)
               ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar11);
      *pdVar2 = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                .m_data.array[0];
      pdVar2[1] = camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[1];
    }
    uVar1 = uVar13 + 1;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)CONCAT44(camRotation_1.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0]._4_4_,(int)uVar13);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (camCorrespondences,(int *)&camRotation_1);
    dVar10 = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols;
    uVar13 = 0;
    if (uVar1 <= ((long)pMVar4 - (long)pMVar5) / 0x18 - 1U) {
      uVar13 = uVar1;
    }
    lVar11 = lVar11 + 0x18;
  }
  auVar9 = vcvtusi2sd_avx512f(in_XMM2,numberPoints);
  lVar12 = 0;
  lVar11 = 0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar9._0_8_ * outlierFraction;
  auVar9 = vroundsd_avx(auVar17,auVar17,9);
  lVar14 = vcvttsd2usi_avx512f(auVar9);
  for (; lVar14 != lVar11; lVar11 = lVar11 + 1) {
    piVar8 = (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (camOffsets->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar3 = piVar8[lVar11];
    camOffset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)&pMVar4[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data + 0x10);
    pMVar4 = pMVar4 + iVar3;
    camOffset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[0];
    camOffset.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = *(double *)
            ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data + 8);
    iVar3 = piVar8[lVar11];
    pMVar7 = (camRotations->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[8] = *(double *)
                ((long)&pMVar7[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data + 0x40);
    pMVar7 = pMVar7 + iVar3;
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 8);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x10);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x18);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x20);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x28);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x30);
    camRotation_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = *(double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x38);
    generateRandomPoint(&bodyPoint,8.0,4.0);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)rotation;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = (double)&bodyPoint;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = (double)position;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&bodyPoint_1,
               (DenseBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&camRotation);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)&camRotation_1;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = (double)&camOffset;
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = (double)&bodyPoint_1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               ((long)&(((bearingVectors->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data + lVar12),
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
                *)&camRotation);
    pMVar16 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              ((long)&(((bearingVectors->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
              + lVar12);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(pMVar16);
    camRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = (double)pMVar16;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               ((long)&(((bearingVectors->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data + lVar12),
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&camRotation);
    lVar12 = lVar12 + 0x18;
  }
  return;
}

Assistant:

void
opengv::generateRandom2D3DCorrespondences(
    const translation_t & position,
    const rotation_t & rotation,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & bearingVectors,
    points_t & points,
    std::vector<int> & camCorrespondences,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 2D3D-correspondences by looping through the cameras
  size_t numberCams = camOffsets.size();
  size_t camCorrespondence = 0;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //get the camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //store the point
    points.push_back(gt.col(i));

    //project the point into the viewpoint frame
    point_t bodyPoint = rotation.transpose()*(gt.col(i) - position);

    //project the point into the camera frame
    bearingVectors.push_back(camRotation.transpose()*(bodyPoint - camOffset));

    //normalize the bearing-vector to 1
    bearingVectors[i] = bearingVectors[i] / bearingVectors[i].norm();

    //add noise
    if( noise > 0.0 )
      bearingVectors[i] = addNoise(noise,bearingVectors[i]);

    //push back the camera correspondence
    camCorrespondences.push_back(camCorrespondence++);
    if(camCorrespondence > (numberCams-1) )
      camCorrespondence = 0;
  }

  //add outliers
  //compute the number of outliers based on fraction
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  //make the first numberOutliers points be outliers
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //extract the camera transformation
    translation_t camOffset = camOffsets[camCorrespondences[i]];
    rotation_t camRotation = camRotations[camCorrespondences[i]];

    //create random point
    point_t p = generateRandomPoint(8,4);

    //project into viewpoint frame
    point_t bodyPoint = rotation.transpose()*(p - position);

    //project into camera-frame and use as outlier measurement
    bearingVectors[i] = camRotation.transpose()*(bodyPoint - camOffset);

    //normalize the bearing vector
    bearingVectors[i] = bearingVectors[i] / bearingVectors[i].norm();
  }
}